

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_ruleparser.h
# Opt level: O3

bool __thiscall BamTools::RuleParser::readToken(RuleParser *this,RuleToken *token)

{
  char cVar1;
  bool bVar2;
  byte *pbVar3;
  char *pcVar4;
  size_type sVar5;
  bool bVar6;
  
  pbVar3 = (byte *)this->m_current;
  while (pbVar3 != (byte *)this->m_end) {
    if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) {
      bVar6 = pbVar3 != (byte *)this->m_end;
      if (bVar6) {
        (token->Value)._M_string_length = 0;
        *(token->Value)._M_dataplus._M_p = '\0';
        pcVar4 = this->m_current;
        if (pcVar4 == this->m_end) {
          return bVar6;
        }
        bVar2 = false;
        goto LAB_001610ba;
      }
      break;
    }
    pbVar3 = pbVar3 + 1;
    this->m_current = (char *)pbVar3;
  }
  bVar6 = false;
switchD_001610d8_caseD_20:
  return bVar6;
switchD_001610d8_caseD_22:
  token->Type = OPERAND;
  std::__cxx11::string::_M_replace_aux
            ((ulong)&token->Value,(token->Value)._M_string_length,0,'\x01');
  pcVar4 = this->m_current;
  bVar2 = true;
  if (pcVar4 == this->m_end) {
    return bVar6;
  }
LAB_001610ba:
  this->m_current = pcVar4 + 1;
  cVar1 = *pcVar4;
  switch(cVar1) {
  case ' ':
    goto switchD_001610d8_caseD_20;
  case '!':
    token->Type = NOT_OPERATOR;
    sVar5 = (token->Value)._M_string_length;
    break;
  case '\"':
  case '#':
  case '$':
  case '%':
  case '\'':
    goto switchD_001610d8_caseD_22;
  case '&':
    if (bVar2) {
LAB_0016119e:
      this->m_current = pcVar4;
      return bVar6;
    }
    token->Type = AND_OPERATOR;
    sVar5 = (token->Value)._M_string_length;
    break;
  case '(':
    token->Type = LEFT_PARENTHESIS;
    sVar5 = (token->Value)._M_string_length;
    break;
  case ')':
    if (bVar2) goto LAB_0016119e;
    token->Type = RIGHT_PARENTHESIS;
    sVar5 = (token->Value)._M_string_length;
    break;
  default:
    if (cVar1 == '\0') {
      return bVar6;
    }
    if (cVar1 == '|') {
      if (bVar2) goto LAB_0016119e;
      token->Type = OR_OPERATOR;
      sVar5 = (token->Value)._M_string_length;
      break;
    }
    goto switchD_001610d8_caseD_22;
  }
  std::__cxx11::string::_M_replace_aux((ulong)&token->Value,sVar5,0,'\x01');
  return bVar6;
}

Assistant:

inline bool RuleParser::readToken(RuleToken& token)
{

    // skip any preceding whitespace
    skipSpaces();
    if (m_current == m_end) return false;

    // clear out prior token value
    token.Value.clear();

    // read chars while still in token
    char c = 1;
    bool keepReading = true;
    bool inOperandString = false;
    while (keepReading && (c != 0)) {

        // get next char
        c = getNextChar();
        switch (c) {

            // current char is '('
            case (LEFT_PARENTHESIS_CHAR):
                token.Type = RuleToken::LEFT_PARENTHESIS;
                token.Value.append(1, LEFT_PARENTHESIS_CHAR);
                keepReading = false;
                break;

            // current char is ')'
            case (RIGHT_PARENTHESIS_CHAR):
                if (inOperandString)
                    --m_current;
                else {
                    token.Type = RuleToken::RIGHT_PARENTHESIS;
                    token.Value.append(1, RIGHT_PARENTHESIS_CHAR);
                }
                keepReading = false;
                break;

            // current char is '&'
            case (AND_OPERATOR_CHAR):
                if (inOperandString)
                    --m_current;
                else {
                    token.Type = RuleToken::AND_OPERATOR;
                    token.Value.append(1, AND_OPERATOR_CHAR);
                }
                keepReading = false;
                break;

            // current char is '|'
            case (OR_OPERATOR_CHAR):
                if (inOperandString)
                    --m_current;
                else {
                    token.Type = RuleToken::OR_OPERATOR;
                    token.Value.append(1, OR_OPERATOR_CHAR);
                }
                keepReading = false;
                break;

            // current char is '!'
            case (NOT_OPERATOR_CHAR):
                token.Type = RuleToken::NOT_OPERATOR;
                token.Value.append(1, NOT_OPERATOR_CHAR);
                keepReading = false;
                break;

            // current char is ' '
            case (SPACE_CHAR):
                keepReading = false;
                break;

            // current char is a true value token
            default:
                if (c != 0) {
                    token.Type = RuleToken::OPERAND;
                    token.Value.append(1, c);
                    inOperandString = true;
                    keepReading = true;
                }
        }
    }

    return true;
}